

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O3

void __thiscall FIX::SessionState::logoutReason(SessionState *this,string *value)

{
  int iVar1;
  
  Mutex::lock(&this->m_mutex);
  std::__cxx11::string::_M_assign((string *)&this->m_logoutReason);
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void logoutReason(const std::string &value) {
    Locker l(m_mutex);
    m_logoutReason = value;
  }